

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reply_deferrable.c
# Opt level: O1

void contextUnref(mpt_metatype *mt)

{
  mpt_reply_context_defer *ctx;
  uintptr_t uVar1;
  
  ctx = (mpt_reply_context_defer *)(mt + -3);
  uVar1 = mpt_refcount_lower((mpt_refcount *)(mt + -1));
  if (uVar1 != 0) {
    (ctx->reply).send = (_func_int_void_ptr_mpt_reply_data_ptr_mpt_message_ptr *)0x0;
    return;
  }
  if (((ctx->reply).send != (_func_int_void_ptr_mpt_reply_data_ptr_mpt_message_ptr *)0x0) &&
     (*(short *)((long)&mt[2]._vptr + 2) != 0)) {
    contextSend(ctx,(mpt_reply_data *)(mt + 2),(mpt_message *)0x0);
  }
  free(ctx);
  return;
}

Assistant:

static void contextUnref(MPT_INTERFACE(metatype) *mt)
{
	MPT_STRUCT(reply_context_defer) *ctx = MPT_baseaddr(reply_context_defer, mt, _mt);
	
	if (mpt_refcount_lower(&ctx->ref)) {
		ctx->reply.send = 0;
		return;
	}
	if (ctx->reply.send && ctx->data.len) {
		contextSend(ctx, &ctx->data, 0);
	}
	free(ctx);
}